

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall
QEvdevTabletHandlerThread::QEvdevTabletHandlerThread
          (QEvdevTabletHandlerThread *this,QString *device,QString *spec,QObject *parent)

{
  QObject *in_RCX;
  QDaemonThread *in_RDI;
  
  QDaemonThread::QDaemonThread(in_RDI,in_RCX);
  *(undefined ***)in_RDI = &PTR_metaObject_0011c668;
  QString::QString((QString *)in_RCX,(QString *)in_RDI);
  QString::QString((QString *)in_RCX,(QString *)in_RDI);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  QThread::start(in_RDI,7);
  return;
}

Assistant:

QEvdevTabletHandlerThread::QEvdevTabletHandlerThread(const QString &device, const QString &spec, QObject *parent)
    : QDaemonThread(parent), m_device(device), m_spec(spec), m_handler(0)
{
    start();
}